

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

uint32 __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count
          (UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *this)

{
  uint uVar1;
  ulong uVar2;
  UnorderedArrayListLink *pUVar3;
  
  uVar2 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
  if (uVar2 < 0xe70) {
    uVar1 = (uint)((uVar2 & 0xffff) >> 4) / 7;
    pUVar3 = (this->m_inlineHeadBlock).Next;
    while( true ) {
      if (pUVar3 == (UnorderedArrayListLink *)0x0) {
        return uVar1;
      }
      uVar2 = (long)pUVar3->CurrPos - (long)pUVar3->BlockData;
      if (0xe6f < uVar2) break;
      uVar1 = uVar1 + (uint)((uVar2 & 0xffff) >> 4) / 7;
      pUVar3 = pUVar3->Next;
    }
  }
  TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
}

Assistant:

uint32 Count() const
        {
            size_t count = (((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T);
            TTDAssert(count <= allocSize, "We somehow wrote in too much data.");

            for (UnorderedArrayListLink* curr = this->m_inlineHeadBlock.Next; curr != nullptr; curr = curr->Next)
            {
                size_t ncount = (((byte*)curr->CurrPos) - ((byte*)curr->BlockData)) / sizeof(T);
                TTDAssert(ncount <= allocSize, "We somehow wrote in too much data.");

                count += ncount;
            }

            return (uint32)count;
        }